

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::GetFullNameInternal
          (cmTarget *this,string *config,bool implib,string *outPrefix,string *outBase,
          string *outSuffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  string *psVar4;
  string *psVar5;
  bool bVar6;
  char *pcVar7;
  _Alloc_hider __s;
  char *extraout_RAX;
  char *pcVar8;
  LinkClosure *pLVar9;
  long *plVar10;
  size_t sVar11;
  size_type *psVar12;
  ulong *puVar13;
  uint uVar14;
  string fw_prefix;
  string ll;
  size_type __dnew_1;
  string local_f0;
  string local_d0;
  string local_b0;
  char *local_90;
  uint local_84;
  string *local_80;
  string *local_78;
  uint local_6c;
  undefined2 *local_68;
  undefined8 local_60;
  undefined2 local_58;
  undefined6 uStack_56;
  char *local_48;
  string *local_40;
  string *local_38;
  
  if (MODULE_LIBRARY < this->TargetTypeValue) {
    std::__cxx11::string::_M_replace
              ((ulong)outPrefix,0,(char *)outPrefix->_M_string_length,0x5e12e9);
    std::__cxx11::string::_M_assign((string *)outBase);
    std::__cxx11::string::_M_replace
              ((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x5e12e9);
    return;
  }
  local_78 = config;
  local_40 = outPrefix;
  if (implib) {
    pcVar2 = this->Makefile;
    paVar1 = &local_d0.field_2;
    local_f0._M_dataplus._M_p = (pointer)0x1b;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    local_d0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_f0);
    local_d0.field_2._M_allocated_capacity._0_4_ = SUB84(local_f0._M_dataplus._M_p,0);
    local_d0.field_2._M_local_buf[4] = (char)((ulong)local_f0._M_dataplus._M_p >> 0x20);
    local_d0.field_2._M_local_buf[5] = (char)((ulong)local_f0._M_dataplus._M_p >> 0x28);
    local_d0.field_2._M_local_buf[6] = (char)((ulong)local_f0._M_dataplus._M_p >> 0x30);
    local_d0.field_2._M_local_buf[7] = (char)((ulong)local_f0._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_d0._M_dataplus._M_p,"CMAKE_IMPORT_LIBRARY_SUFFIX",0x1b);
    local_d0._M_string_length = (size_type)local_f0._M_dataplus._M_p;
    local_d0._M_dataplus._M_p[(long)local_f0._M_dataplus._M_p] = '\0';
    pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT17(local_d0.field_2._M_local_buf[7],
                               CONCAT16(local_d0.field_2._M_local_buf[6],
                                        CONCAT15(local_d0.field_2._M_local_buf[5],
                                                 CONCAT14(local_d0.field_2._M_local_buf[4],
                                                          local_d0.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
    if (pcVar7 == (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)outPrefix,0,(char *)outPrefix->_M_string_length,0x5e12e9);
      std::__cxx11::string::_M_replace((ulong)outBase,0,(char *)outBase->_M_string_length,0x5e12e9);
      std::__cxx11::string::_M_replace
                ((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x5e12e9);
      return;
    }
    if ((this->TargetTypeValue < OBJECT_LIBRARY) && (this->TargetTypeValue != STATIC_LIBRARY)) {
      local_d0.field_2._M_allocated_capacity._0_4_ = 0x4f504d49;
      local_d0.field_2._M_local_buf[4] = 'R';
      local_d0.field_2._M_local_buf[5] = 'T';
      local_d0.field_2._M_local_buf[6] = '_';
      local_d0.field_2._M_local_buf[7] = 'P';
      local_d0.field_2._8_5_ = 0x5849464552;
      local_d0._M_string_length = 0xd;
      local_d0.field_2._M_local_buf[0xd] = '\0';
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      __s._M_p = GetProperty(this,&local_d0,this->Makefile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT17(local_d0.field_2._M_local_buf[7],
                                 CONCAT16(local_d0.field_2._M_local_buf[6],
                                          CONCAT15(local_d0.field_2._M_local_buf[5],
                                                   CONCAT14(local_d0.field_2._M_local_buf[4],
                                                            local_d0.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_d0.field_2._M_allocated_capacity._0_4_ = 0x4f504d49;
      local_d0.field_2._M_local_buf[4] = 'R';
      local_d0.field_2._M_local_buf[5] = 'T';
      local_d0.field_2._M_local_buf[6] = '_';
      local_d0.field_2._M_local_buf[7] = 'S';
      local_d0.field_2._8_5_ = 0x5849464655;
      local_d0._M_string_length = 0xd;
      local_d0.field_2._M_local_buf[0xd] = '\0';
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      pcVar7 = GetProperty(this,&local_d0,this->Makefile);
      local_90 = pcVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT17(local_d0.field_2._M_local_buf[7],
                                 CONCAT16(local_d0.field_2._M_local_buf[6],
                                          CONCAT15(local_d0.field_2._M_local_buf[5],
                                                   CONCAT14(local_d0.field_2._M_local_buf[4],
                                                            local_d0.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
        pcVar7 = extraout_RAX;
      }
      local_84 = (uint)CONCAT71((int7)((ulong)pcVar7 >> 8),1);
      goto LAB_003678a6;
    }
  }
  paVar1 = &local_d0.field_2;
  local_d0.field_2._M_allocated_capacity._0_4_ = 0x46455250;
  local_d0.field_2._M_local_buf[4] = 'I';
  local_d0.field_2._M_local_buf[5] = 'X';
  local_d0._M_string_length = 6;
  local_d0.field_2._M_local_buf[6] = '\0';
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  __s._M_p = GetProperty(this,&local_d0,this->Makefile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT17(local_d0.field_2._M_local_buf[7],
                             CONCAT16(local_d0.field_2._M_local_buf[6],
                                      CONCAT15(local_d0.field_2._M_local_buf[5],
                                               CONCAT14(local_d0.field_2._M_local_buf[4],
                                                        local_d0.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_d0.field_2._M_allocated_capacity._0_4_ = 0x46465553;
  local_d0.field_2._M_local_buf[4] = 'I';
  local_d0.field_2._M_local_buf[5] = 'X';
  local_d0._M_string_length = 6;
  local_d0.field_2._M_local_buf[6] = '\0';
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  local_90 = GetProperty(this,&local_d0,this->Makefile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT17(local_d0.field_2._M_local_buf[7],
                             CONCAT16(local_d0.field_2._M_local_buf[6],
                                      CONCAT15(local_d0.field_2._M_local_buf[5],
                                               CONCAT14(local_d0.field_2._M_local_buf[4],
                                                        local_d0.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  local_84 = 0;
LAB_003678a6:
  local_80 = outBase;
  local_38 = outSuffix;
  if (local_78->_M_string_length == 0) {
    local_48 = (char *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase(&local_d0,local_78);
    std::__cxx11::string::append((char *)&local_d0);
    pcVar7 = GetProperty(this,&local_d0,this->Makefile);
    if (((pcVar7 == (char *)0x0) || (bVar6 = IsAppBundleOnApple(this), bVar6)) ||
       (bVar6 = IsFrameworkOnApple(this), bVar6)) {
      pcVar7 = (char *)0x0;
    }
    local_48 = pcVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT17(local_d0.field_2._M_local_buf[7],
                               CONCAT16(local_d0.field_2._M_local_buf[6],
                                        CONCAT15(local_d0.field_2._M_local_buf[5],
                                                 CONCAT14(local_d0.field_2._M_local_buf[4],
                                                          local_d0.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
  }
  bVar6 = local_84._0_1_;
  uVar14 = local_84 & 0xff;
  pcVar7 = GetPrefixVariableInternal(this,local_84._0_1_);
  local_6c = uVar14;
  pcVar8 = GetSuffixVariableInternal(this,bVar6);
  pLVar9 = GetLinkClosure(this,local_78);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar3 = (pLVar9->LinkerLanguage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (pLVar9->LinkerLanguage)._M_string_length);
  if (local_d0._M_string_length != 0) {
    if (pcVar8 != (char *)0x0 && local_90 == (char *)0x0) {
      if (*pcVar8 == '\0') {
        local_90 = (char *)0x0;
      }
      else {
        local_58 = 0x5f;
        local_60 = 1;
        local_68 = &local_58;
        strlen(pcVar8);
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_68,0,(char *)0x0,(ulong)pcVar8);
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_b0.field_2._M_allocated_capacity = *psVar12;
          local_b0.field_2._8_8_ = plVar10[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar12;
          local_b0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_b0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
        puVar13 = (ulong *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_f0.field_2._M_allocated_capacity = *puVar13;
          local_f0.field_2._8_8_ = plVar10[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *puVar13;
          local_f0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_f0._M_string_length = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_68 != &local_58) {
          operator_delete(local_68,CONCAT62(uStack_56,local_58) + 1);
        }
        local_90 = cmMakefile::GetDefinition(this->Makefile,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (pcVar7 != (char *)0x0 &&
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__s._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (*pcVar7 == '\0') {
        __s._M_p = (pointer)0x0;
      }
      else {
        local_58 = 0x5f;
        local_60 = 1;
        local_68 = &local_58;
        strlen(pcVar7);
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_68,0,(char *)0x0,(ulong)pcVar7);
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_b0.field_2._M_allocated_capacity = *psVar12;
          local_b0.field_2._8_8_ = plVar10[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar12;
          local_b0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_b0._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
        puVar13 = (ulong *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_f0.field_2._M_allocated_capacity = *puVar13;
          local_f0.field_2._8_8_ = plVar10[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *puVar13;
          local_f0._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_f0._M_string_length = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_68 != &local_58) {
          operator_delete(local_68,CONCAT62(uStack_56,local_58) + 1);
        }
        __s._M_p = cmMakefile::GetDefinition(this->Makefile,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if ((pcVar7 != (char *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    pcVar2 = this->Makefile;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    sVar11 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,pcVar7,pcVar7 + sVar11);
    __s._M_p = cmMakefile::GetSafeDefinition(pcVar2,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  psVar4 = local_80;
  if ((pcVar8 != (char *)0x0) && (local_90 == (char *)0x0)) {
    pcVar2 = this->Makefile;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    sVar11 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,pcVar8,pcVar8 + sVar11);
    local_90 = cmMakefile::GetSafeDefinition(pcVar2,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_allocated_capacity =
       local_f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar6 = IsFrameworkOnApple(this);
  if (bVar6) {
    GetOutputName(&local_b0,this,local_78,false);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_f0);
    local_90 = (char *)0x0;
    __s._M_p = local_f0._M_dataplus._M_p;
  }
  bVar6 = IsCFBundleOnApple(this);
  if (bVar6) {
    GetCFBundleDirectory(&local_b0,this,local_78,false);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_f0);
    local_90 = (char *)0x0;
    __s._M_p = local_f0._M_dataplus._M_p;
  }
  psVar5 = local_40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    __s._M_p = "";
  }
  pcVar7 = (char *)local_40->_M_string_length;
  strlen(__s._M_p);
  std::__cxx11::string::_M_replace((ulong)psVar5,0,pcVar7,(ulong)__s._M_p);
  GetOutputName(&local_b0,this,local_78,SUB41(local_6c,0));
  std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_b0._M_dataplus._M_p);
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)psVar4);
  local_b0.field_2._M_allocated_capacity = 0x4f49535245564f53;
  local_b0.field_2._8_2_ = 0x4e;
  local_b0._M_string_length = 9;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  pcVar7 = GetProperty(this,&local_b0,this->Makefile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar7 != (char *)0x0) && ((char)local_84 == '\0' && this->TargetTypeValue == SHARED_LIBRARY)
     ) {
    pcVar2 = this->Makefile;
    local_68 = (undefined2 *)0x26;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    local_b0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_b0,(ulong)&local_68);
    local_b0.field_2._M_allocated_capacity = (size_type)local_68;
    *(undefined8 *)((long)local_b0._M_dataplus._M_p + 0x10) = 0x4d414e5f59524152;
    *(undefined8 *)((long)local_b0._M_dataplus._M_p + 0x18) = 0x565f485449575f45;
    *(undefined8 *)local_b0._M_dataplus._M_p = 0x48535f454b414d43;
    *(undefined8 *)((long)local_b0._M_dataplus._M_p + 8) = 0x42494c5f44455241;
    builtin_strncpy((char *)((long)local_b0._M_dataplus._M_p + 0x1e),"_VERSION",8);
    local_b0._M_string_length = (size_type)local_68;
    local_b0._M_dataplus._M_p[(long)local_68] = '\0';
    bVar6 = cmMakefile::IsOn(pcVar2,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    psVar4 = local_80;
    if (bVar6) {
      std::__cxx11::string::append((char *)local_80);
      std::__cxx11::string::append((char *)psVar4);
    }
  }
  psVar4 = local_38;
  pcVar7 = "";
  if (local_90 != (char *)0x0) {
    pcVar7 = local_90;
  }
  pcVar8 = (char *)local_38->_M_string_length;
  strlen(pcVar7);
  std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar8,(ulong)pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT17(local_d0.field_2._M_local_buf[7],
                             CONCAT16(local_d0.field_2._M_local_buf[6],
                                      CONCAT15(local_d0.field_2._M_local_buf[5],
                                               CONCAT14(local_d0.field_2._M_local_buf[4],
                                                        local_d0.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  return;
}

Assistant:

void cmTarget::GetFullNameInternal(const std::string& config,
                                   bool implib,
                                   std::string& outPrefix,
                                   std::string& outBase,
                                   std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if(this->GetType() != cmTarget::STATIC_LIBRARY &&
     this->GetType() != cmTarget::SHARED_LIBRARY &&
     this->GetType() != cmTarget::MODULE_LIBRARY &&
     this->GetType() != cmTarget::EXECUTABLE)
    {
    outPrefix = "";
    outBase = this->GetName();
    outSuffix = "";
    return;
    }

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if(implib &&
     !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"))
    {
    outPrefix = "";
    outBase = "";
    outSuffix = "";
    return;
    }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if(this->GetType() != cmTarget::SHARED_LIBRARY &&
     this->GetType() != cmTarget::MODULE_LIBRARY &&
     this->GetType() != cmTarget::EXECUTABLE)
    {
    implib = false;
    }

  // Compute the full name for main target types.
  const char* targetPrefix = (implib
                              ? this->GetProperty("IMPORT_PREFIX")
                              : this->GetProperty("PREFIX"));
  const char* targetSuffix = (implib
                              ? this->GetProperty("IMPORT_SUFFIX")
                              : this->GetProperty("SUFFIX"));
  const char* configPostfix = 0;
  if(!config.empty())
    {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if(configPostfix &&
       (this->IsAppBundleOnApple() || this->IsFrameworkOnApple()))
      {
      configPostfix = 0;
      }
    }
  const char* prefixVar = this->GetPrefixVariableInternal(implib);
  const char* suffixVar = this->GetSuffixVariableInternal(implib);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if(!ll.empty())
    {
    if(!targetSuffix && suffixVar && *suffixVar)
      {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
      }
    if(!targetPrefix && prefixVar && *prefixVar)
      {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
      }
    }

  // if there is no prefix on the target use the cmake definition
  if(!targetPrefix && prefixVar)
    {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar);
    }
  // if there is no suffix on the target use the cmake definition
  if(!targetSuffix && suffixVar)
    {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar);
    }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if(this->IsFrameworkOnApple())
    {
    fw_prefix = this->GetOutputName(config, false);
    fw_prefix += ".framework/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  if(this->IsCFBundleOnApple())
    {
    fw_prefix = this->GetCFBundleDirectory(config, false);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix?targetPrefix:"";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, implib);

  // Append the per-configuration postfix.
  outBase += configPostfix?configPostfix:"";

  // Name shared libraries with their version number on some platforms.
  if(const char* soversion = this->GetProperty("SOVERSION"))
    {
    if(this->GetType() == cmTarget::SHARED_LIBRARY && !implib &&
       this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION"))
      {
      outBase += "-";
      outBase += soversion;
      }
    }

  // Append the suffix.
  outSuffix = targetSuffix?targetSuffix:"";
}